

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphElements.cpp
# Opt level: O1

int __thiscall
dg::vr::VRLocation::connect(VRLocation *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  int iVar3;
  int extraout_EAX;
  sockaddr *__addr_00;
  undefined4 in_register_00000034;
  undefined8 *local_20;
  
  local_20 = (undefined8 *)operator_new(0x20);
  *local_20 = this;
  local_20[1] = CONCAT44(in_register_00000034,__fd);
  uVar1._0_2_ = __addr->sa_family;
  uVar1._2_1_ = __addr->sa_data[0];
  uVar1._3_1_ = __addr->sa_data[1];
  uVar1._4_1_ = __addr->sa_data[2];
  uVar1._5_1_ = __addr->sa_data[3];
  uVar1._6_1_ = __addr->sa_data[4];
  uVar1._7_1_ = __addr->sa_data[5];
  local_20[2] = uVar1;
  __addr->sa_family = 0;
  __addr->sa_data[0] = '\0';
  __addr->sa_data[1] = '\0';
  __addr->sa_data[2] = '\0';
  __addr->sa_data[3] = '\0';
  __addr->sa_data[4] = '\0';
  __addr->sa_data[5] = '\0';
  *(undefined4 *)(local_20 + 3) = 3;
  iVar3 = connect(this,(int)&local_20,__addr_00,(socklen_t)uVar1);
  puVar2 = local_20;
  if (local_20 != (undefined8 *)0x0) {
    if ((long *)local_20[2] != (long *)0x0) {
      (**(code **)(*(long *)local_20[2] + 8))();
    }
    puVar2[2] = 0;
    operator_delete(puVar2,0x20);
    iVar3 = extraout_EAX;
  }
  return iVar3;
}

Assistant:

void VRLocation::connect(VRLocation *target, std::unique_ptr<VROp> &&op) {
    connect(std::unique_ptr<VREdge>(new VREdge(this, target, std::move(op))));
}